

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O3

void dlib::blas_bindings::
     matrix_assign_blas<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout,dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>>
               (matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *dest,matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_false>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
                      *src)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  local_38;
  
  bVar4 = matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>
          ::
          aliases<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
                    (src,(matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                          *)dest);
  if (bVar4) {
    matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    matrix(&local_38,(dest->data).nr_,(dest->data).nc_);
    matrix_assign_blas_proxy<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>
              (&local_38,src,1.0,false,false);
    pfVar1 = (dest->data).data;
    (dest->data).data = local_38.data.data;
    lVar2 = (dest->data).nr_;
    lVar3 = (dest->data).nc_;
    (dest->data).nr_ = local_38.data.nr_;
    (dest->data).nc_ = local_38.data.nc_;
    if (pfVar1 != (float *)0x0) {
      local_38.data.data = pfVar1;
      local_38.data.nr_ = lVar2;
      local_38.data.nc_ = lVar3;
      operator_delete__(pfVar1);
    }
    return;
  }
  matrix_assign_blas_proxy<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>
            (dest,src,1.0,false,false);
  return;
}

Assistant:

void matrix_assign_blas (
            matrix<T,NR,NC,MM,L>& dest,
            const src_exp& src
        )
        {
            if (src.aliases(dest))
            {
                matrix<T,NR,NC,MM,L> temp(dest.nr(),dest.nc());
                matrix_assign_blas_proxy(temp,src,1,false, false);
                temp.swap(dest);
            }
            else
            {
                matrix_assign_blas_proxy(dest,src,1,false, false);
            }
        }